

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

vector<folding_set,_std::allocator<folding_set>_> *
folding_sets_from_folding_info
          (vector<folding_set,_std::allocator<folding_set>_> *__return_storage_ptr__,
          vector<folding_info,_std::allocator<folding_info>_> *in_info)

{
  uint uVar1;
  pointer pfVar2;
  long lVar3;
  uint in_EDX;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  folding_info *info;
  pointer pfVar8;
  value_type local_48;
  
  (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.diff = 0;
  local_48.mode = single;
  local_48.range_start = 0;
  pfVar8 = (in_info->super__Vector_base<folding_info,_std::allocator<folding_info>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (in_info->super__Vector_base<folding_info,_std::allocator<folding_info>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = 0;
  iVar4 = 2;
  lVar6 = 0;
  do {
    if (pfVar8 == pfVar2) {
      if (lVar3 != 0) {
        local_48._12_4_ = 0;
        local_48.range_end = in_EDX;
        std::vector<folding_set,_std::allocator<folding_set>_>::push_back
                  (__return_storage_ptr__,&local_48);
      }
      return __return_storage_ptr__;
    }
    uVar1 = pfVar8->in_codepoint;
    lVar7 = (ulong)pfVar8->out_codepoint - (ulong)uVar1;
    if (lVar6 == 0) {
      local_48.range_start = uVar1;
      lVar3 = lVar7;
      local_48.diff = lVar7;
    }
    else if (iVar4 == 2) {
      if (uVar1 == in_EDX + 1 && lVar7 == lVar6) {
        local_48._0_8_ = (ulong)local_48.range_start << 0x20;
        iVar4 = 0;
      }
      else {
        if (uVar1 != in_EDX + 2 || lVar7 != lVar6) goto LAB_001f71ba;
        local_48.mode = 1;
        iVar4 = 1;
      }
    }
    else {
      if ((iVar4 == 0) && (lVar6 == lVar7)) {
        uVar5 = in_EDX + 1;
        iVar4 = 0;
      }
      else {
        if ((iVar4 != 1) || (lVar6 != lVar7)) goto LAB_001f71ba;
        uVar5 = in_EDX + 2;
        iVar4 = 1;
      }
      if (uVar5 != uVar1) {
LAB_001f71ba:
        local_48._12_4_ = 0;
        local_48.range_end = in_EDX;
        std::vector<folding_set,_std::allocator<folding_set>_>::push_back
                  (__return_storage_ptr__,&local_48);
        local_48.range_start = pfVar8->in_codepoint;
        local_48.mode = 2;
        iVar4 = 2;
        lVar3 = lVar7;
        uVar1 = pfVar8->in_codepoint;
        local_48.diff = lVar7;
      }
    }
    in_EDX = uVar1;
    pfVar8 = pfVar8 + 1;
    lVar6 = lVar7;
  } while( true );
}

Assistant:

std::vector<folding_set> folding_sets_from_folding_info(const std::vector<folding_info>& in_info) {
	std::vector<folding_set> result;

	folding_set current{};
	uint32_t last_match;
	for (auto& info : in_info) {
		int64_t diff = static_cast<int64_t>(info.out_codepoint) - static_cast<int64_t>(info.in_codepoint);

		if (current.diff == 0) {
			// this is a new set; set range_start and diff
			current.range_start = info.in_codepoint;
			current.diff = diff;
			last_match = info.in_codepoint;
			continue;
		}

		if (current.mode == folding_set::mode_type::single) {
			// We don't know what mode we are yet; check if this is constant
			if (diff == current.diff
				&& info.in_codepoint == last_match + 1) {
				// diff is same for range_start + 1; must be a constant-diff continuous set
				current.mode = folding_set::mode_type::constant;
				last_match = info.in_codepoint;
				continue;
			}

			// Either one-off fold, or alternating set. Check if in_codepoint is last_match + 2
			if (diff == current.diff
				&& info.in_codepoint == last_match + 2) {
				// Looks like an alternating set
				current.mode = folding_set::mode_type::alternating;
				last_match = info.in_codepoint;
				continue;
			}
		}

		if (current.mode == folding_set::mode_type::constant // For constant offset diffs to continue...
			&& current.diff == diff // Diff must be the same
			&& last_match + 1 == info.in_codepoint) { // And current codepoint must be 1 higher than previous
			// This matches the current range pattern; just update last_match and carry on
			last_match = info.in_codepoint;
			continue;
		}

		if (current.mode == folding_set::mode_type::alternating // For alternating sets to continue...
			&& current.diff == diff // Diff must be same
			&& last_match + 2 == info.in_codepoint) { // And current codepoint must be 2 higher than previous
			last_match = info.in_codepoint;
			continue;
		}

		// This isn't a continuation of the current set; push current and start a new set
		current.range_end = last_match;
		result.push_back(current);

		current = folding_set{};
		current.range_start = info.in_codepoint;
		current.diff = diff;
		last_match = info.in_codepoint;
	}

	// Push final range
	if (current.diff != 0) {
		current.range_end = last_match;
		result.push_back(current);
	}

	return result;
}